

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyNewLiteralTextNode(Lexer *lexer,ctmbstr txt)

{
  byte bVar1;
  Node *pNVar2;
  byte *pbVar3;
  
  pNVar2 = (Node *)(*lexer->allocator->vtbl->alloc)(lexer->allocator,0x68);
  pNVar2->parent = (Node *)0x0;
  pNVar2->prev = (Node *)0x0;
  pNVar2->next = (Node *)0x0;
  pNVar2->content = (Node *)0x0;
  pNVar2->last = (Node *)0x0;
  pNVar2->attributes = (AttVal *)0x0;
  pNVar2->was = (Dict *)0x0;
  pNVar2->tag = (Dict *)0x0;
  pNVar2->element = (tmbstr)0x0;
  pNVar2->start = 0;
  pNVar2->end = 0;
  pNVar2->type = RootNode;
  pNVar2->line = 0;
  pNVar2->column = 0;
  pNVar2->closed = no;
  pNVar2->implicit = no;
  pNVar2->linebreak = no;
  if (lexer != (Lexer *)0x0) {
    pNVar2->line = lexer->lines;
    pNVar2->column = lexer->columns;
  }
  pNVar2->type = TextNode;
  pNVar2->start = lexer->lexsize;
  bVar1 = *txt;
  if (bVar1 != 0) {
    pbVar3 = (byte *)(txt + 1);
    do {
      prvTidyAddCharToLexer(lexer,(uint)bVar1);
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
  }
  pNVar2->end = lexer->lexsize;
  return pNVar2;
}

Assistant:

Node* TY_(NewLiteralTextNode)( Lexer *lexer, ctmbstr txt )
{
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    node->start = lexer->lexsize;
    AddStringToLexer( lexer, txt );
    node->end = lexer->lexsize;
    return node;
}